

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatedamagebin.cpp
# Opt level: O0

void __thiscall
ValidateDamageBin::CheckInterpolationDamageValuesWithinRange(ValidateDamageBin *this)

{
  float fVar1;
  int binCentre;
  OASIS_FLOAT midPoint;
  ValidateDamageBin *this_local;
  
  if (((this->dbd_).interpolation < (this->dbd_).bin_from) ||
     ((this->dbd_).bin_to < (this->dbd_).interpolation)) {
    fprintf(_stderr,
            "ERROR: Interpolation damage value %f for bin %d on line %d lies outside range [%f, %f]:\n%s\n"
            ,(double)(this->dbd_).interpolation,(double)(this->dbd_).bin_from,
            (double)(this->dbd_).bin_to,(ulong)(uint)(this->dbd_).bin_index,
            (ulong)(uint)(this->super_Validate).lineno_);
    Validate::PrintErrorMessage(&this->super_Validate);
  }
  fVar1 = ((this->dbd_).bin_to - (this->dbd_).bin_from) / 2.0 + (this->dbd_).bin_from;
  if ((int)((this->dbd_).interpolation * 10000.0 + 0.5) != (int)(fVar1 * 10000.0 + 0.5)) {
    fprintf(_stderr,
            "WARNING: Interpolation damage value %f does not lie at centre %f of bin %d on line %d. Are you sure this is what you want?\n%s\n"
            ,(double)(this->dbd_).interpolation,(double)fVar1,(ulong)(uint)(this->dbd_).bin_index,
            (ulong)(uint)(this->super_Validate).lineno_);
    (this->super_Validate).warnings_ = true;
  }
  return;
}

Assistant:

inline void ValidateDamageBin::CheckInterpolationDamageValuesWithinRange() {

  if ((dbd_.interpolation < dbd_.bin_from) ||
      (dbd_.bin_to < dbd_.interpolation)) {

    fprintf(stderr, "ERROR: Interpolation damage value %f for bin %d"
                    " on line %d lies outside range [%f, %f]:\n%s\n",
            dbd_.interpolation, dbd_.bin_index, lineno_,
            dbd_.bin_from, dbd_.bin_to, line_);
    PrintErrorMessage();

  }

  OASIS_FLOAT midPoint = (dbd_.bin_to - dbd_.bin_from) / 2.0 + dbd_.bin_from;
  int binCentre = (int)(midPoint * 10000 + 0.5);
  if ((int)(dbd_.interpolation * 10000 + 0.5) != binCentre) {

    fprintf(stderr, "WARNING: Interpolation damage value %f does not lie at"
		    " centre %f of bin %d on line %d. Are you sure this is"
		    " what you want?\n%s\n",
	    dbd_.interpolation, midPoint, dbd_.bin_index, lineno_, line_);
    warnings_ = true;

  }

}